

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void normalize_suite::normalize_even(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  reference piVar2;
  ulong uVar3;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  allocator_type local_99;
  vector<int,_std::allocator<int>_> local_98;
  circular_view<int,_18446744073709551615UL> local_78;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  int local_38 [10];
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_78.member.cap = 4;
  local_78.member.size = 0;
  local_78.member.next = 4;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input._M_len = 5;
  input._M_array = (iterator)&local_98;
  local_78.member.data = local_38;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_78,input);
  uVar1 = local_78.member.cap * 2;
  if ((uVar1 & local_78.member.cap * 2 - 1) == 0) {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_78.member.next - local_78.member.size);
  }
  else {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_78.member.next - local_78.member.size) % uVar1);
  }
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_78;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_98);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd6f,"void normalize_suite::normalize_even()",piVar2 != local_38);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_78);
  uVar1 = local_78.member.cap * 2;
  if ((uVar1 & local_78.member.cap * 2 - 1) == 0) {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(uVar1 - 1 & local_78.member.next - local_78.member.size);
  }
  else {
    local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_78.member.next - local_78.member.size) % uVar1);
  }
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_78;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_98);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd71,"void normalize_suite::normalize_even()",piVar2 == local_38);
  local_38[4] = 0x16;
  local_38[5] = 0x21;
  local_38[6] = 0x2c;
  local_38[7] = 0x37;
  __l._M_len = 4;
  __l._M_array = local_38 + 4;
  std::vector<int,_std::allocator<int>_>::vector(&local_98,__l,&local_99);
  uVar1 = local_78.member.cap * 2;
  if ((uVar1 & local_78.member.cap * 2 - 1) == 0) {
    uVar3 = local_78.member.next - local_78.member.size & uVar1 - 1;
    sStack_40 = uVar1 - 1 & local_78.member.next;
  }
  else {
    uVar3 = (local_78.member.next - local_78.member.size) % uVar1;
    sStack_40 = local_78.member.next % uVar1;
  }
  first_end.current = sStack_40;
  first_end.parent = &local_78;
  first_begin.current = uVar3;
  first_begin.parent = &local_78;
  local_48 = &local_78;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd75,"void normalize_suite::normalize_even()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  uVar1 = local_78.member.cap * 2;
  if ((uVar1 & local_78.member.cap * 2 - 1) == 0) {
    uVar3 = local_78.member.next - local_78.member.size & uVar1 - 1;
    sStack_50 = uVar1 - 1 & local_78.member.next;
  }
  else {
    uVar3 = (local_78.member.next - local_78.member.size) % uVar1;
    sStack_50 = local_78.member.next % uVar1;
  }
  first_end_00.current = sStack_50;
  first_end_00.parent = &local_78;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_78;
  local_58 = &local_78;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd77,"void normalize_suite::normalize_even()",first_begin_00,first_end_00,local_38,
             local_38 + local_78.member.size);
  if ((view_pointer)
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void normalize_even()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // 55 22 33 44 => 22 33 44 55
        span = { 11, 22, 33, 44, 55 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 22, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
}